

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a6670 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a6677 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001a6660 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a6668 = 0x2d2d2d2d2d2d2d;
    DAT_001a666f = 0x2d;
    _DAT_001a6650 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a6658 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001a6640 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a6648 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001a6638 = 0x2d2d2d2d2d2d2d2d;
    DAT_001a667f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }